

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_PrintMulti1(Dtt_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *p_01;
  int Entry;
  long lVar7;
  ulong uVar8;
  
  uVar5 = 0;
  do {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(400);
    p_00->pArray = piVar6;
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 100;
    p_01->nSize = 0;
    piVar6 = (int *)malloc(400);
    p_01->pArray = piVar6;
    iVar4 = p->nClasses;
    if (iVar4 < 1) {
LAB_00525554:
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      if (piVar6 != (int *)0x0) {
        free(piVar6);
      }
      free(p_01);
      return;
    }
    lVar7 = 0;
    do {
      if (p->pNodes[lVar7] == uVar5) {
        Vec_IntPush(p_00,p->pTimes[lVar7]);
        iVar4 = p->nClasses;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
    uVar1 = p_00->nSize;
    if ((long)(int)uVar1 == 0) goto LAB_00525554;
    piVar6 = p_00->pArray;
    qsort(piVar6,(long)(int)uVar1,4,Vec_IntSortCompare1);
    if ((int)uVar1 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = *piVar6;
    Entry = 1;
    if (uVar1 == 1) {
LAB_005254a5:
      Vec_IntPush(p_01,iVar4);
      Vec_IntPush(p_01,Entry);
    }
    else {
      uVar8 = 1;
      do {
        iVar2 = piVar6[uVar8];
        if (iVar4 == iVar2) {
          Entry = Entry + 1;
        }
        else {
          if (iVar2 <= iVar4) {
            __assert_fail("Prev < Entry",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                          ,0x27f,"void Dtt_PrintMulti1(Dtt_Man_t *)");
          }
          Vec_IntPush(p_01,iVar4);
          Vec_IntPush(p_01,Entry);
          Entry = 1;
          iVar4 = iVar2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
      if (0 < Entry) goto LAB_005254a5;
    }
    printf("n=%d : ",(ulong)uVar5);
    iVar4 = p_01->nSize;
    if (1 < iVar4) {
      piVar3 = p_01->pArray;
      lVar7 = 1;
      do {
        printf("%d=%d ",(ulong)(uint)piVar3[lVar7 + -1],(ulong)(uint)piVar3[lVar7]);
        lVar7 = lVar7 + 2;
      } while ((int)lVar7 < iVar4);
    }
    putchar(10);
    free(piVar6);
    free(p_00);
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
    }
    free(p_01);
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Dtt_PrintMulti1( Dtt_Man_t * p )
{
    int i, n, Entry, Count, Prev;
    for ( n = 0; n < 16; n++ )
    {
        Vec_Int_t * vTimes = Vec_IntAlloc( 100 );
        Vec_Int_t * vUsed  = Vec_IntAlloc( 100 );
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                Vec_IntPush( vTimes, p->pTimes[i] );
        if ( Vec_IntSize(vTimes) == 0 )
        {
            Vec_IntFree(vTimes);
            Vec_IntFree(vUsed);
            break;
        }
        Vec_IntSort( vTimes, 0 );
        Count = 1;
        Prev = Vec_IntEntry( vTimes, 0 );
        Vec_IntForEachEntryStart( vTimes, Entry, i, 1 )
            if ( Prev == Entry )
                Count++;
            else
            {
                assert( Prev < Entry );
                Vec_IntPushTwo( vUsed, Prev, Count );
                Count = 1;
                Prev = Entry;
            }
        if ( Count > 0 )
            Vec_IntPushTwo( vUsed, Prev, Count );
        printf( "n=%d : ", n);
        Vec_IntForEachEntryDouble( vUsed, Prev, Entry, i )
            printf( "%d=%d ", Prev, Entry );
        printf( "\n" );
        Vec_IntFree( vTimes );
        Vec_IntFree( vUsed );
    }
}